

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *
assembler::anon_unknown_0::_get_arguments
          (vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
           *__return_storage_ptr__,external_function *f)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  iterator __position;
  ulong uVar4;
  int iVar5;
  value_type reg;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> arg_regs;
  operand local_4c;
  void *local_48;
  iterator iStack_40;
  operand *local_38;
  
  if (((anonymous_namespace)::_get_arguments(assembler::external_function_const&)::arg_reg == '\0')
     && (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                      _get_arguments(assembler::external_function_const&)::arg_reg),
        iVar3 != 0)) {
    get_linux_calling_registers();
    __cxa_atexit(std::
                 vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                 ~vector,&_get_arguments::arg_reg,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::_get_arguments(assembler::external_function_const&)
                         ::arg_reg);
  }
  if (((anonymous_namespace)::_get_arguments(assembler::external_function_const&)::arg_float_reg ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   _get_arguments(assembler::external_function_const&)::
                                   arg_float_reg), iVar3 != 0)) {
    get_floating_point_registers();
    __cxa_atexit(std::
                 vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                 ~vector,&_get_arguments::arg_float_reg,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::_get_arguments(assembler::external_function_const&)
                         ::arg_float_reg);
  }
  local_48 = (void *)0x0;
  iStack_40._M_current = (operand *)0x0;
  local_38 = (operand *)0x0;
  lVar2 = *(long *)&f->arguments;
  if (*(long *)&f->field_0x30 != lVar2) {
    uVar4 = 0;
    iVar3 = 0;
    iVar5 = 0;
    do {
      if (*(int *)(lVar2 + uVar4 * 4) == 2) {
        if (iStack_40._M_current == local_38) {
          std::vector<assembler::asmcode::operand,std::allocator<assembler::asmcode::operand>>::
          _M_realloc_insert<assembler::asmcode::operand_const&>
                    ((vector<assembler::asmcode::operand,std::allocator<assembler::asmcode::operand>>
                      *)&local_48,iStack_40,
                     _get_arguments::arg_float_reg.
                     super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar3);
        }
        else {
          *iStack_40._M_current =
               _get_arguments::arg_float_reg.
               super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar3];
          iStack_40._M_current = iStack_40._M_current + 1;
        }
        iVar3 = iVar3 + 1;
      }
      else {
        if (iStack_40._M_current == local_38) {
          std::vector<assembler::asmcode::operand,std::allocator<assembler::asmcode::operand>>::
          _M_realloc_insert<assembler::asmcode::operand_const&>
                    ((vector<assembler::asmcode::operand,std::allocator<assembler::asmcode::operand>>
                      *)&local_48,iStack_40,
                     _get_arguments::arg_reg.
                     super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar5);
        }
        else {
          *iStack_40._M_current =
               _get_arguments::arg_reg.
               super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar5];
          iStack_40._M_current = iStack_40._M_current + 1;
        }
        iVar5 = iVar5 + 1;
      }
      uVar4 = uVar4 + 1;
      lVar2 = *(long *)&f->arguments;
    } while (uVar4 < (ulong)(*(long *)&f->field_0x30 - lVar2 >> 2));
  }
  (__return_storage_ptr__->
  super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = *(long *)&f->arguments;
  if (*(long *)&f->field_0x30 != lVar2) {
    uVar4 = 0;
    do {
      uVar1 = *(uint *)(lVar2 + uVar4 * 4);
      if (uVar1 < 2) {
LAB_001333b3:
        local_4c = *(operand *)((long)local_48 + uVar4 * 4);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<assembler::asmcode::operand,std::allocator<assembler::asmcode::operand>>::
          _M_realloc_insert<assembler::asmcode::operand_const&>
                    ((vector<assembler::asmcode::operand,std::allocator<assembler::asmcode::operand>>
                      *)__return_storage_ptr__,__position,&local_4c);
        }
        else {
LAB_001333ee:
          *__position._M_current = local_4c;
          (__return_storage_ptr__->
          super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
          )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      else if (uVar1 == 2) {
        local_4c = *(operand *)((long)local_48 + uVar4 * 4);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (__return_storage_ptr__->
            super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001333ee;
        std::vector<assembler::asmcode::operand,std::allocator<assembler::asmcode::operand>>::
        _M_realloc_insert<assembler::asmcode::operand_const&>
                  ((vector<assembler::asmcode::operand,std::allocator<assembler::asmcode::operand>>
                    *)__return_storage_ptr__,__position,&local_4c);
      }
      else if (uVar1 == 3) goto LAB_001333b3;
      uVar4 = uVar4 + 1;
      lVar2 = *(long *)&f->arguments;
    } while (uVar4 < (ulong)(*(long *)&f->field_0x30 - lVar2 >> 2));
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<asmcode::operand> _get_arguments(const external_function& f)
    {
#ifdef _WIN32
    static std::vector<asmcode::operand> arg_reg = get_windows_calling_registers();
#else
    static std::vector<asmcode::operand> arg_reg = get_linux_calling_registers();
#endif
    static std::vector<asmcode::operand> arg_float_reg = get_floating_point_registers();
#ifndef _WIN32
    std::vector<asmcode::operand> arg_regs;
    int regular_arg_id = 0;
    int floating_arg_id = 0;
    for (size_t i = 0; i < f.arguments.size(); ++i)
      {
      if (f.arguments[i] == external_function::T_DOUBLE)
        {
        arg_regs.push_back(arg_float_reg[floating_arg_id]);
        ++floating_arg_id;
        }
      else
        {
        arg_regs.push_back(arg_reg[regular_arg_id]);
        ++regular_arg_id;
        }
      }
#endif

    std::vector<asmcode::operand> args;
    for (size_t i = 0; i < f.arguments.size(); ++i)
      {
      switch (f.arguments[i])
        {
        case external_function::T_CHAR_POINTER:
        case external_function::T_INT64:
        case external_function::T_BOOL:
        {
#ifdef _WIN32
        auto reg = arg_reg[i];
#else
        auto reg = arg_regs[i];
#endif
        args.push_back(reg);
        break;
        }
        case external_function::T_DOUBLE:
        {
#ifdef _WIN32
        auto reg = arg_float_reg[i];
#else
        auto reg = arg_regs[i];
#endif
        args.push_back(reg);
        break;
        }
        }
      }
    return args;
    }